

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O3

VarValue *
deqp::gles2::Functional::generateZeroVarValue(VarValue *__return_storage_ptr__,DataType type)

{
  uint uVar1;
  undefined4 extraout_var;
  VarValue *pVVar2;
  ulong __n;
  
  uVar1 = glu::getDataTypeScalarSize(type);
  __return_storage_ptr__->type = type;
  if (((type - TYPE_FLOAT < 4) || (type - TYPE_FLOAT_MAT2 < 9 || type - TYPE_DOUBLE_MAT2 < 9)) ||
     (type - TYPE_INT < 4)) {
    if (0 < (int)uVar1) {
      __n = (ulong)uVar1 << 2;
LAB_00377bb2:
      pVVar2 = (VarValue *)memset(&__return_storage_ptr__->val,0,__n);
      return pVVar2;
    }
  }
  else if (type - TYPE_BOOL < 4) {
    if (0 < (int)uVar1) {
      __n = (ulong)uVar1;
      goto LAB_00377bb2;
    }
  }
  else if (type - TYPE_SAMPLER_1D < 0x1e) {
    (__return_storage_ptr__->val).floatV[0] = 0.0;
    *(undefined8 *)((long)&__return_storage_ptr__->val + 4) = 0x3df5c28f00000000;
    *(undefined8 *)((long)&__return_storage_ptr__->val + 0xc) = 0x3eb851eb3e75c28f;
  }
  return (VarValue *)CONCAT44(extraout_var,uVar1);
}

Assistant:

static VarValue generateZeroVarValue (const glu::DataType type)
{
	const int	numElems = glu::getDataTypeScalarSize(type);
	VarValue	result;
	result.type = type;

	if (glu::isDataTypeFloatOrVec(type) || glu::isDataTypeMatrix(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.floatV[i] = 0.0f;
	}
	else if (glu::isDataTypeIntOrIVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.intV[i] = 0;
	}
	else if (glu::isDataTypeBoolOrBVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.boolV[i] = false;
	}
	else if (glu::isDataTypeSampler(type))
	{
		result.val.samplerV.unit = 0;

		for (int i = 0; i < 4; i++)
			result.val.samplerV.fillColor[i] = 0.12f * (float)i;
	}
	else
		DE_ASSERT(false);

	return result;
}